

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

void __thiscall cppcms::xss::rules::rules(rules *this,string *file_name)

{
  bool bVar1;
  data *this_00;
  ostream *this_01;
  runtime_error *prVar2;
  value v;
  int line_number;
  ostringstream ss;
  ifstream f;
  value local_3d0;
  int local_3c4;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [11];
  long local_228 [4];
  byte abStack_208 [488];
  
  this_00 = (data *)operator_new(0xf8);
  data::data(this_00);
  (this->d).ptr_ = this_00;
  json::value::copyable::copyable(&local_3d0.d);
  std::ifstream::ifstream(local_228,(file_name->_M_dataplus)._M_p,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::operator+(local_3a0,"xss::rules: failed to open file: ",file_name);
    booster::runtime_error::runtime_error(prVar2,local_3a0);
    *(undefined ***)prVar2 = &PTR__runtime_error_00284840;
    (prVar2->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
    __cxa_throw(prVar2,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  local_3c4 = 0;
  bVar1 = json::value::load(&local_3d0,(istream *)local_228,true,&local_3c4);
  if (bVar1) {
    anon_unknown_8::load_from_json(this,&local_3d0);
    std::ifstream::~ifstream(local_228);
    json::value::copyable::~copyable(&local_3d0.d);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3a0,"xss::rules: error parsing JSON file ",0x24);
  this_01 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3a0,(file_name->_M_dataplus)._M_p,
                       file_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this_01," in line ",9);
  std::ostream::operator<<(this_01,local_3c4);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  booster::runtime_error::runtime_error(prVar2,&local_3c0);
  *(undefined ***)prVar2 = &PTR__runtime_error_00284840;
  (prVar2->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
  __cxa_throw(prVar2,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

rules::rules(std::string const &file_name) : d(new data())
	{
		json::value v;
		booster::nowide::ifstream f(file_name.c_str());
		if(!f) {
			throw cppcms_error("xss::rules: failed to open file: " + file_name);
		}
		int line_number = 0;
		if(!v.load(f,true,&line_number)) {
			std::ostringstream ss;
			ss << "xss::rules: error parsing JSON file " << file_name << " in line " << line_number;
			throw cppcms_error(ss.str());
		}
		load_from_json(*this,v);
	}